

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O0

Vector<float,_4> __thiscall
tcu::Vector<unsigned_long,_4>::cast<float>(Vector<unsigned_long,_4> *this)

{
  long in_RSI;
  ulong extraout_XMM0_Qa;
  ulong uVar1;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar2;
  float local_3c;
  int local_1c;
  int i;
  Vector<unsigned_long,_4> *this_local;
  Vector<float,_4> *res;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar1 = extraout_XMM0_Qa;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    uVar1 = *(ulong *)(in_RSI + (long)local_1c * 8);
    in_XMM1_Qa = CONCAT44((int)((ulong)in_XMM1_Qa >> 0x20),(float)(long)uVar1);
    local_3c = (float)uVar1;
    uVar1 = (ulong)(uint)local_3c;
    *(float *)((long)this->m_data + (long)local_1c * 4) = local_3c;
  }
  VVar2.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar2.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar2.m_data[0] = (float)(int)uVar1;
  VVar2.m_data[1] = (float)(int)(uVar1 >> 0x20);
  return (Vector<float,_4>)VVar2.m_data;
}

Assistant:

inline Vector<NewT, Size> Vector<T, Size>::cast (void) const
{
	Vector<NewT, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = NewT(m_data[i]);
	return res;
}